

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRecognizer.cpp
# Opt level: O1

Encodings xercesc_4_0::XMLRecognizer::encodingForName(XMLCh *encName)

{
  int iVar1;
  Encodings EVar2;
  
  EVar2 = Encodings_Max;
  if ((encName != L"XERCES-XMLCH") &&
     (iVar1 = XMLString::compareString(encName,L"XERCES-XMLCH"), iVar1 != 0)) {
    iVar1 = XMLString::compareString(encName,L"UTF-8");
    EVar2 = UTF_8;
    if ((iVar1 != 0) && (iVar1 = XMLString::compareString(encName,L"UTF8"), iVar1 != 0)) {
      iVar1 = XMLString::compareString(encName,L"US-ASCII");
      EVar2 = US_ASCII;
      if ((((iVar1 != 0) && (iVar1 = XMLString::compareString(encName,L"USASCII"), iVar1 != 0)) &&
          (iVar1 = XMLString::compareString(encName,L"ASCII"), iVar1 != 0)) &&
         (iVar1 = XMLString::compareString(encName,L"US_ASCII"), iVar1 != 0)) {
        iVar1 = XMLString::compareString(encName,L"UTF-16 (LE)");
        EVar2 = UTF_16L;
        if ((iVar1 != 0) && (iVar1 = XMLString::compareString(encName,L"UTF-16LE"), iVar1 != 0)) {
          iVar1 = XMLString::compareString(encName,L"UTF-16 (BE)");
          EVar2 = UTF_16B;
          if ((iVar1 != 0) && (iVar1 = XMLString::compareString(encName,L"UTF-16BE"), iVar1 != 0)) {
            iVar1 = XMLString::compareString(encName,L"UTF-16");
            if (iVar1 == 0) {
              iVar1 = 6;
            }
            else {
              iVar1 = XMLString::compareString(encName,L"UCS-4 (LE)");
              if (iVar1 == 0) {
                return UCS_4L;
              }
              iVar1 = XMLString::compareString(encName,L"UCS-4LE");
              if (iVar1 == 0) {
                return UCS_4L;
              }
              iVar1 = XMLString::compareString(encName,L"UCS-4 (BE)");
              if (iVar1 == 0) {
                return UCS_4B;
              }
              iVar1 = XMLString::compareString(encName,L"UCS-4BE");
              if (iVar1 == 0) {
                return UCS_4B;
              }
              iVar1 = XMLString::compareString(encName,L"UCS4");
              if (iVar1 != 0) {
                return OtherEncoding;
              }
              iVar1 = 2;
            }
            EVar2 = iVar1 - (uint)XMLPlatformUtils::fgXMLChBigEndian;
          }
        }
      }
    }
  }
  return EVar2;
}

Assistant:

XMLRecognizer::Encodings
XMLRecognizer::encodingForName(const XMLCh* const encName)
{
    //
    //  Compare the passed string, assume input string is already uppercased,
    //  to the variations that we recognize.
    //
    //  !!NOTE: Note that we don't handle EBCDIC here because we don't handle
    //  that one ourselves. It is allowed to fall into 'other'.
    //
    if (encName == XMLUni::fgXMLChEncodingString ||
        !XMLString::compareString(encName, XMLUni::fgXMLChEncodingString))
    {
        return XMLRecognizer::XERCES_XMLCH;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUTF8EncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUTF8EncodingString2))
    {
        return XMLRecognizer::UTF_8;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUSASCIIEncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUSASCIIEncodingString2)
         ||  !XMLString::compareString(encName, XMLUni::fgUSASCIIEncodingString3)
         ||  !XMLString::compareString(encName, XMLUni::fgUSASCIIEncodingString4))
    {
        return XMLRecognizer::US_ASCII;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUTF16LEncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUTF16LEncodingString2))
    {
        return XMLRecognizer::UTF_16L;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUTF16BEncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUTF16BEncodingString2))
    {
        return XMLRecognizer::UTF_16B;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUTF16EncodingString))
    {
        return XMLPlatformUtils::fgXMLChBigEndian?XMLRecognizer::UTF_16B:XMLRecognizer::UTF_16L;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUCS4LEncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUCS4LEncodingString2))
    {
        return XMLRecognizer::UCS_4L;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUCS4BEncodingString)
         ||  !XMLString::compareString(encName, XMLUni::fgUCS4BEncodingString2))
    {
        return XMLRecognizer::UCS_4B;
    }
    else if (!XMLString::compareString(encName, XMLUni::fgUCS4EncodingString))
    {
        return XMLPlatformUtils::fgXMLChBigEndian?XMLRecognizer::UCS_4B:XMLRecognizer::UCS_4L;
    }

    // Return 'other' since we don't recognizer it
    return XMLRecognizer::OtherEncoding;
}